

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::_List_iterator<State>_>::copyAppend
          (QGenericArrayOps<std::_List_iterator<State>_> *this,_List_iterator<State> *b,
          _List_iterator<State> *e)

{
  _List_iterator<State> *p_Var1;
  long lVar2;
  
  if (b != e) {
    p_Var1 = (this->super_QArrayDataPointer<std::_List_iterator<State>_>).ptr;
    lVar2 = (this->super_QArrayDataPointer<std::_List_iterator<State>_>).size;
    for (; b < e; b = b + 1) {
      p_Var1[lVar2]._M_node = b->_M_node;
      (this->super_QArrayDataPointer<std::_List_iterator<State>_>).size = lVar2 + 1;
      lVar2 = lVar2 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }